

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsay.c
# Opt level: O3

void print_voice_list(OpenJTalk *openjtalk)

{
  long *plVar1;
  size_t sVar2;
  size_t sVar3;
  HtsVoiceFilelist *list;
  char *__s;
  long lVar4;
  ulong uVar5;
  long *plVar6;
  char padding [260];
  char local_138 [264];
  
  plVar1 = (long *)openjtalk_getHTSVoiceList();
  if (plVar1 != (long *)0x0) {
    uVar5 = 0;
    plVar6 = plVar1;
    do {
      sVar2 = strlen((char *)plVar6[2]);
      if (sVar2 < uVar5) {
        sVar2 = uVar5;
      }
      plVar6 = (long *)*plVar6;
      uVar5 = sVar2;
    } while (plVar6 != (long *)0x0);
    if (plVar1 != (long *)0x0) {
      do {
        __s = (char *)plVar1[2];
        sVar3 = strlen(__s);
        local_138[0] = ' ';
        local_138[1] = '\0';
        if (~sVar3 + (sVar2 & 0xfffffffffffffffc) + 4 != 0) {
          lVar4 = sVar3 + (-3 - (sVar2 & 0xfffffffffffffffc));
          do {
            sVar3 = strlen(local_138);
            (local_138 + sVar3)[0] = ' ';
            (local_138 + sVar3)[1] = '\0';
            lVar4 = lVar4 + 1;
          } while (lVar4 != 0);
          __s = (char *)plVar1[2];
        }
        printf("%s%s%s\n",__s,local_138,plVar1[1]);
        plVar1 = (long *)*plVar1;
      } while (plVar1 != (long *)0x0);
    }
  }
  return;
}

Assistant:

void print_voice_list(OpenJTalk *openjtalk)
{
	char padding[MAX_PATH];
	HtsVoiceFilelist *result = openjtalk_getHTSVoiceList(openjtalk);
	size_t length = 0;

	for (HtsVoiceFilelist*list = result; list != NULL; list = list->succ)
	{
		size_t len = strlen(list->name);
		if (length < len)
		{
			length = len;
		}
	}
	int tab_len = 4;
	length = (length / tab_len) * tab_len + tab_len;
	for (HtsVoiceFilelist*list = result; list != NULL; list = list->succ)
	{
		size_t diff = length - strlen((char*)list->name);
		strcpy(padding, " ");
		while (--diff)
		{
			strcat(padding, " ");
		}
		printf("%s%s%s\n", (char*)list->name, padding, (char*)list->path);
	}
}